

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_widgets.cpp
# Opt level: O0

Am_Wrapper * get_text_widget_value_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  Am_Value *initial;
  ostream *this;
  ostrstream local_210 [8];
  ostrstream oss;
  char local_a8 [8];
  char line [100];
  Am_Value v;
  Am_Object owner;
  Am_Object *self_local;
  
  if (get_text_widget_value_proc(Am_Object&)::val == '\0') {
    iVar2 = __cxa_guard_acquire(&get_text_widget_value_proc(Am_Object&)::val);
    if (iVar2 != 0) {
      Am_String::Am_String(&get_text_widget_value_proc::val,"",true);
      __cxa_atexit(Am_String::~Am_String,&get_text_widget_value_proc::val,&__dso_handle);
      __cxa_guard_release(&get_text_widget_value_proc(Am_Object&)::val);
    }
  }
  Am_Object::Get_Owner((Am_Object *)&v.value,(Am_Slot_Flags)self);
  bVar1 = Am_Object::Valid((Am_Object *)&v.value);
  if (bVar1) {
    initial = Am_Object::Get((Am_Object *)&v.value,0x169,0);
    Am_Value::Am_Value((Am_Value *)(line + 0x60),initial);
    if (line._96_2_ != -0x7ff8) {
      std::ostrstream::ostrstream(local_210,local_a8,100,_S_out);
      this = operator<<((ostream *)local_210,(Am_Value *)(line + 0x60));
      std::ostream::operator<<(this,std::ends<char,std::char_traits<char>>);
      Am_Value::operator=((Am_Value *)(line + 0x60),local_a8);
      std::ostrstream::~ostrstream(local_210);
    }
    self_local = (Am_Object *)Am_Value::operator_cast_to_Am_Wrapper_((Am_Value *)(line + 0x60));
    Am_Value::~Am_Value((Am_Value *)(line + 0x60));
  }
  else {
    self_local = (Am_Object *)
                 Am_String::operator_cast_to_Am_Wrapper_(&get_text_widget_value_proc::val);
  }
  Am_Object::~Am_Object((Am_Object *)&v.value);
  return (Am_Wrapper *)self_local;
}

Assistant:

Am_Define_String_Formula(get_text_widget_value)
{
  static Am_String val("");

  Am_Object owner = self.Get_Owner();
  if (owner.Valid()) {
    Am_Value v = owner.Get(Am_VALUE);
    if (v.type != Am_STRING) { //generate string from the value by printing it
      char line[100];
      OSTRSTREAM_CONSTR(oss, line, 100, std::ios::out);
      oss << v << std::ends;
      OSTRSTREAM_COPY(oss, line, 100);
      v = line; //now use the string as the value
    }
    return v;
  } else
    return val;
}